

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpf_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_218fed::Loop8Test6Param_hbd_ValueCheck_Test::TestBody
          (Loop8Test6Param_hbd_ValueCheck_Test *this)

{
  bool bVar1;
  uint16_t uVar2;
  Message *pMVar3;
  AssertHelper *this_00;
  uint16_t *in_RDI;
  AssertionResult gtest_ar;
  int j_1;
  RegisterStateCheckMMX reg_check_mmx;
  RegisterStateCheck reg_check;
  int j;
  int32_t p;
  uint8_t thresh [16];
  uint8_t limit [16];
  uint8_t blimit [16];
  uint8_t tmp;
  int err_count;
  int i;
  int first_failure;
  int err_count_total;
  uint16_t ref_s [1024];
  uint16_t s [1024];
  int count_test_block;
  ACMRandom rnd;
  char (*in_stack_ffffffffffffef08) [72];
  Message *in_stack_ffffffffffffef10;
  int *in_stack_ffffffffffffef18;
  uint8_t *in_stack_ffffffffffffef20;
  char *in_stack_ffffffffffffef28;
  int line;
  Type in_stack_ffffffffffffef3c;
  AssertHelper *in_stack_ffffffffffffef40;
  AssertionResult local_10b0;
  int local_10a0;
  Message *in_stack_ffffffffffffef88;
  int in_stack_ffffffffffffef90;
  undefined4 in_stack_ffffffffffffef94;
  int local_1024;
  ushort local_1018 [1024];
  ushort auStack_818 [1028];
  undefined4 local_10;
  
  libaom_test::ACMRandom::DeterministicSeed();
  libaom_test::ACMRandom::ACMRandom
            ((ACMRandom *)in_stack_ffffffffffffef10,(int)((ulong)in_stack_ffffffffffffef08 >> 0x20))
  ;
  local_10 = 10000;
  for (local_1024 = 0; local_1024 < 10000; local_1024 = local_1024 + 1) {
    GetOuterThresh((ACMRandom *)0x481525);
    GetInnerThresh((ACMRandom *)0x481619);
    GetHevThresh((ACMRandom *)0x48170d);
    in_stack_ffffffffffffef94 = 0x20;
    for (in_stack_ffffffffffffef90 = 0; in_stack_ffffffffffffef90 < 0x400;
        in_stack_ffffffffffffef90 = in_stack_ffffffffffffef90 + 1) {
      uVar2 = libaom_test::ACMRandom::Rand16((ACMRandom *)in_stack_ffffffffffffef10);
      auStack_818[in_stack_ffffffffffffef90] = uVar2 & (ushort)*(undefined4 *)(in_RDI + 0xe);
      local_1018[in_stack_ffffffffffffef90] = auStack_818[in_stack_ffffffffffffef90];
    }
    call_filter(in_RDI,(int)((ulong)in_stack_ffffffffffffef28 >> 0x20),in_stack_ffffffffffffef20,
                (uint8_t *)in_stack_ffffffffffffef18,(uint8_t *)in_stack_ffffffffffffef10,
                (int)((ulong)*(undefined8 *)(in_RDI + 0x14) >> 0x20),
                (hbdloop_op_t)in_stack_ffffffffffffef40);
    libaom_test::RegisterStateCheckMMX::RegisterStateCheckMMX
              ((RegisterStateCheckMMX *)&stack0xffffffffffffef72);
    in_stack_ffffffffffffef08 = *(char (**) [72])(in_RDI + 0x10);
    call_filter(in_RDI,(int)((ulong)in_stack_ffffffffffffef28 >> 0x20),in_stack_ffffffffffffef20,
                (uint8_t *)in_stack_ffffffffffffef18,(uint8_t *)in_stack_ffffffffffffef10,
                (int)((ulong)in_stack_ffffffffffffef08 >> 0x20),
                (hbdloop_op_t)in_stack_ffffffffffffef40);
    libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX((RegisterStateCheckMMX *)0x481926);
    for (local_10a0 = 0; local_10a0 < 0x400; local_10a0 = local_10a0 + 1) {
    }
  }
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffef28,(char *)in_stack_ffffffffffffef20,in_stack_ffffffffffffef18,
             (int *)in_stack_ffffffffffffef10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_10b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffef40);
    pMVar3 = testing::Message::operator<<(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
    line = (int)((ulong)pMVar3 >> 0x20);
    pMVar3 = testing::Message::operator<<
                       (in_stack_ffffffffffffef10,(char (*) [27])in_stack_ffffffffffffef08);
    testing::Message::operator<<(in_stack_ffffffffffffef10,(int *)in_stack_ffffffffffffef08);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x481a82)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffef40,in_stack_ffffffffffffef3c,(char *)in_RDI,line,
               (char *)pMVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffef94,in_stack_ffffffffffffef90),
               in_stack_ffffffffffffef88);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x481ad0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x481b20);
  return;
}

Assistant:

TEST_P(Loop8Test6Param_hbd, ValueCheck) { VALCHECK(uint16_t, 16); }